

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void __thiscall ssl_ctx_st::~ssl_ctx_st(ssl_ctx_st *this)

{
  ssl_ctx_st *this_local;
  
  SSL_CTX_flush_sessions(this,0);
  CRYPTO_free_ex_data(0x41e580,this,(CRYPTO_EX_DATA *)&this->md5);
  CRYPTO_MUTEX_cleanup((CRYPTO_MUTEX *)&this->cert_store);
  lh_SSL_SESSION_free(*(lhash_st_SSL_SESSION **)&(this->stats).sess_connect_good);
  (**(code **)&this->cipher_list_by_id[4].stack)();
  bssl::Array<unsigned_short>::~Array((Array<unsigned_short> *)&this[1].cert_store);
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
             &this->next_protos_advertised_cb);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&this->rbuf_freelist);
  bssl::Array<unsigned_short>::~Array((Array<unsigned_short> *)&this->freelist_max_len);
  bssl::Vector<bssl::CertCompressionAlg>::~Vector
            ((Vector<bssl::CertCompressionAlg> *)&this->psk_identity_hint);
  std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter> *)
             &this->tlsext_opaque_prf_input_callback_arg);
  bssl::Array<unsigned_char>::~Array((Array<unsigned_char> *)&this->tlsext_status_arg);
  std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<char,_bssl::internal::Deleter> *)&this->tlsext_servername_arg);
  std::unique_ptr<bssl::TicketKey,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::TicketKey,_bssl::internal::Deleter> *)&this->client_cert_engine);
  std::unique_ptr<bssl::TicketKey,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::TicketKey,_bssl::internal::Deleter> *)&this->quiet_shutdown);
  std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::CERT,_bssl::internal::Deleter> *)&this->read_ahead);
  std::optional<bssl::Array<unsigned_char>_>::~optional
            ((optional<bssl::Array<unsigned_char>_> *)&this->client_CA);
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&this->info_callback);
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&this->extra_certs);
  std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> *)
             &this->get_session_cb);
  return;
}

Assistant:

ssl_ctx_st::~ssl_ctx_st() {
  // Free the internal session cache. Note that this calls the caller-supplied
  // remove callback, so we must do it before clearing ex_data. (See ticket
  // [openssl.org #212].)
  SSL_CTX_flush_sessions(this, 0);

  CRYPTO_free_ex_data(&g_ex_data_class_ssl_ctx, this, &ex_data);

  CRYPTO_MUTEX_cleanup(&lock);
  lh_SSL_SESSION_free(sessions);
  x509_method->ssl_ctx_free(this);
}